

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall ON_BinaryArchive::WriteMode(ON_BinaryArchive *this)

{
  archive_mode aVar1;
  byte bVar2;
  
  aVar1 = this->m_mode;
  if ((aVar1 < (write3dm|read)) && ((0x6fU >> (aVar1 & 0x1f) & 1) != 0)) {
    bVar2 = 0x4c >> ((byte)aVar1 & 0x1f);
  }
  else {
    bVar2 = 0;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,0x4039,"","Invalid m_mode.");
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool ON_BinaryArchive::WriteMode() const
{
  bool bIsWriting = false;

  switch (m_mode)
  {
  case ON::archive_mode::unset_archive_mode:
    break;
  case ON::archive_mode::read:
    break;
  case ON::archive_mode::write:
    bIsWriting = true;
    break;
  case ON::archive_mode::readwrite:
    bIsWriting = true;
    break;
  case ON::archive_mode::read3dm:
    break;
  case ON::archive_mode::write3dm:
    bIsWriting = true;
    break;
  default:
    ON_ERROR("Invalid m_mode.");
    break;
  }

  return bIsWriting;
}